

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGParseManager.cpp
# Opt level: O2

BGParseManager * BGParseManager::GetBGParseManager(void)

{
  HeapAllocator *alloc;
  BGParseManager *pBVar1;
  JobProcessor *pJVar2;
  undefined1 local_60 [8];
  TrackAllocData data;
  AutoCriticalSection lock;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  data._32_8_ = &s_staticMemberLock;
  CCLock::Enter(&s_staticMemberLock.super_CCLock);
  if (s_BGParseManager == (BGParseManager *)0x0) {
    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
              ((AutoNestedHandledExceptionType *)((long)&lock.cs + 4),ExceptionType_DisableCheck);
    local_60 = (undefined1  [8])&typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_a16c91b;
    data.filename._0_4_ = 0x21;
    alloc = Memory::HeapAllocator::TrackAllocInfo
                      (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_60);
    pBVar1 = (BGParseManager *)new<Memory::HeapAllocator>(0x68,alloc,0x2f6726);
    BGParseManager(pBVar1);
    s_BGParseManager = pBVar1;
    pJVar2 = JsUtil::JobManager::Processor((JobManager *)pBVar1);
    (**pJVar2->_vptr_JobProcessor)(pJVar2,s_BGParseManager);
    AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
              ((AutoNestedHandledExceptionType *)((long)&lock.cs + 4));
  }
  pBVar1 = s_BGParseManager;
  AutoCriticalSection::~AutoCriticalSection((AutoCriticalSection *)&data.line);
  return pBVar1;
}

Assistant:

BGParseManager* BGParseManager::GetBGParseManager()
{
    AutoCriticalSection lock(&s_staticMemberLock);
    if (s_BGParseManager == nullptr)
    {        
        AUTO_NESTED_HANDLED_EXCEPTION_TYPE(ExceptionType_DisableCheck);
        s_BGParseManager = HeapNew(BGParseManager);
        s_BGParseManager->Processor()->AddManager(s_BGParseManager);
    }
    return s_BGParseManager;
}